

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.cc
# Opt level: O0

int finish(hexdump_ctx *ctx)

{
  int iVar1;
  undefined1 local_25 [4];
  undefined1 local_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char buf [5];
  uint l;
  uint n_bytes;
  hexdump_ctx *ctx_local;
  
  buf._1_4_ = ctx->used;
  if (buf._1_4_ == 0) {
    ctx_local._4_4_ = 1;
  }
  else {
    OPENSSL_memset(local_25,0x20,4);
    local_21 = 0x7c;
    while (ctx->used < 0x10) {
      cStack_20 = '\x03';
      cStack_1f = '\0';
      cStack_1e = '\0';
      buf[0] = '\0';
      if (ctx->used == 7) {
        cStack_20 = '\x04';
        cStack_1f = '\0';
        cStack_1e = '\0';
        buf[0] = '\0';
      }
      else if (ctx->used == 0xf) {
        cStack_20 = '\x05';
        cStack_1f = '\0';
        cStack_1e = '\0';
        buf[0] = '\0';
      }
      iVar1 = BIO_write((BIO *)ctx->bio,local_25,_cStack_20);
      if (iVar1 < 0) {
        return 0;
      }
      ctx->used = ctx->used + 1;
    }
    ctx->right_chars[(uint)buf._1_4_] = '|';
    ctx->right_chars[buf._1_4_ + 1] = '\n';
    iVar1 = BIO_write((BIO *)ctx->bio,ctx->right_chars,buf._1_4_ + 2);
    if (iVar1 < 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int finish(struct hexdump_ctx *ctx) {
  // See the comments in |hexdump| for the details of this format.
  const unsigned n_bytes = ctx->used;
  unsigned l;
  char buf[5];

  if (n_bytes == 0) {
    return 1;
  }

  OPENSSL_memset(buf, ' ', 4);
  buf[4] = '|';

  for (; ctx->used < 16; ctx->used++) {
    l = 3;
    if (ctx->used == 7) {
      l = 4;
    } else if (ctx->used == 15) {
      l = 5;
    }
    if (BIO_write(ctx->bio, buf, l) < 0) {
      return 0;
    }
  }

  ctx->right_chars[n_bytes] = '|';
  ctx->right_chars[n_bytes + 1] = '\n';
  if (BIO_write(ctx->bio, ctx->right_chars, n_bytes + 2) < 0) {
    return 0;
  }
  return 1;
}